

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asc2log.c
# Opt level: O0

void prframe(FILE *file,timeval *tv,int dev,cu_t *cf,char dir)

{
  int in_EDX;
  undefined8 *in_RSI;
  FILE *in_RDI;
  char in_R8B;
  char *in_stack_00000028;
  
  fprintf(in_RDI,"(%llu.%06llu) ",*in_RSI,in_RSI[1]);
  if (in_EDX < 1) {
    fprintf(in_RDI,"canX ");
  }
  else {
    fprintf(in_RDI,"can%d ",(ulong)(in_EDX - 1));
  }
  snprintf_canframe(in_stack_00000028,(size_t)file,(cu_t *)tv,dev);
  if (in_R8B == '.') {
    fprintf(in_RDI,"%s\n",prframe::abuf);
  }
  else {
    fprintf(in_RDI,"%s %c\n",prframe::abuf,(ulong)(uint)(int)in_R8B);
  }
  return;
}

Assistant:

static void prframe(FILE *file, struct timeval *tv, int dev,
		    cu_t *cf, char dir)
{
	static char abuf[BUFLEN];

	fprintf(file, "(%llu.%06llu) ", (unsigned long long)tv->tv_sec, (unsigned long long)tv->tv_usec);

	if (dev > 0)
		fprintf(file, "can%d ", dev-1);
	else
		fprintf(file, "canX ");

	snprintf_canframe(abuf, sizeof(abuf), cf, 0);

	if (dir == NO_DIR)
		fprintf(file, "%s\n", abuf);
	else
		fprintf(file, "%s %c\n", abuf, dir);
}